

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O2

uint __thiscall
ON_Object::MoveUserData
          (ON_Object *this,ON_Object *source_object,ON_UUID source_userdata_item_id,
          UserDataConflictResolution userdata_conflict_resolution,bool bDeleteAllSourceItems)

{
  ON_UserData *pOVar1;
  bool bVar2;
  bool bVar3;
  ON_UserData **ppOVar4;
  ON_UserData *pOVar5;
  ON_UserData *source_ud_next;
  ON_UserData *source_ud_move_this;
  ON_UserData *pOVar6;
  uint uVar7;
  ON_UUID source_userdata_item_id_local;
  
  source_userdata_item_id_local.Data4 = source_userdata_item_id.Data4;
  source_userdata_item_id_local._0_8_ = source_userdata_item_id._0_8_;
  bVar2 = ::operator==(&ON_nil_uuid,&source_userdata_item_id_local);
  pOVar1 = source_object->m_userdata_list;
  if ((bVar2) && (this->m_userdata_list == (ON_UserData *)0x0)) {
    if (pOVar1 == (ON_UserData *)0x0) {
      uVar7 = 0;
    }
    else {
      ppOVar4 = &this->m_userdata_list;
      *ppOVar4 = pOVar1;
      source_object->m_userdata_list = (ON_UserData *)0x0;
      uVar7 = 0;
      while (pOVar1 = *ppOVar4, pOVar1 != (ON_UserData *)0x0) {
        pOVar1->m_userdata_owner = this;
        uVar7 = uVar7 + 1;
        ppOVar4 = &pOVar1->m_userdata_next;
      }
    }
  }
  else {
    source_object->m_userdata_list = (ON_UserData *)0x0;
    uVar7 = 0;
    source_ud_move_this = (ON_UserData *)0x0;
    while (pOVar6 = source_ud_move_this, source_ud_move_this = pOVar1,
          source_ud_move_this != (ON_UserData *)0x0) {
      pOVar1 = source_ud_move_this->m_userdata_next;
      source_ud_move_this->m_userdata_owner = (ON_Object *)0x0;
      source_ud_move_this->m_userdata_next = (ON_UserData *)0x0;
      if (((bVar2) ||
          (bVar3 = ::operator==(&source_ud_move_this->m_userdata_uuid,&source_userdata_item_id_local
                               ), bVar3)) &&
         (pOVar5 = TransferUserDataItem
                             (this,(ON_UserData *)0x0,source_ud_move_this,true,
                              userdata_conflict_resolution), pOVar5 != (ON_UserData *)0x0)) {
        uVar7 = uVar7 + 1;
        source_ud_move_this = pOVar6;
      }
      else if ((source_ud_move_this->m_userdata_owner == (ON_Object *)0x0) &&
              (source_ud_move_this->m_userdata_next == (ON_UserData *)0x0)) {
        if (bDeleteAllSourceItems) {
          (*(source_ud_move_this->super_ON_Object)._vptr_ON_Object[4])(source_ud_move_this);
          source_ud_move_this = pOVar6;
        }
        else {
          source_ud_move_this->m_userdata_owner = source_object;
          if (source_object->m_userdata_list == (ON_UserData *)0x0) {
            source_object->m_userdata_list = source_ud_move_this;
          }
          else if (pOVar6 != (ON_UserData *)0x0) {
            pOVar6->m_userdata_next = source_ud_move_this;
          }
        }
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                   ,0x68a,"","There is a serious bug in this code.");
        source_ud_move_this = pOVar6;
      }
    }
  }
  return uVar7;
}

Assistant:

unsigned int ON_Object::MoveUserData(
  ON_Object& source_object,
  ON_UUID source_userdata_item_id,
  ON_Object::UserDataConflictResolution userdata_conflict_resolution,
  bool bDeleteAllSourceItems)
{
  unsigned int moved_item_count = 0;

  const bool bIgnoreUserDataItemId = (ON_nil_uuid == source_userdata_item_id);

  if ( nullptr == m_userdata_list && bIgnoreUserDataItemId )
  {
    // quick and simple when the "this" doesn't
    // have any user data.
    if ( nullptr != source_object.m_userdata_list )
    {
      m_userdata_list = source_object.m_userdata_list;
      source_object.m_userdata_list = nullptr;
      for (ON_UserData* dest_ud = m_userdata_list; nullptr != dest_ud; dest_ud = dest_ud->m_userdata_next)
      {
        dest_ud->m_userdata_owner = this;
        moved_item_count++;
      }
    }
  }
  else
  {    
    // Carefully move userdata an item at a time from source_object to "this"
    const bool bPerformConflictCheck = true;
    ON_UserData* source_ud_next = source_object.m_userdata_list;
    source_object.m_userdata_list = nullptr;
    ON_UserData* source_object_userdata_last = nullptr;
    for ( ON_UserData* source_ud = source_ud_next; nullptr != source_ud; source_ud = source_ud_next)
    {
      source_ud_next = source_ud->m_userdata_next;
      source_ud->m_userdata_next = nullptr;
      source_ud->m_userdata_owner = nullptr;

      if (bIgnoreUserDataItemId || source_ud->m_userdata_uuid == source_userdata_item_id)
      {
        if (TransferUserDataItem(nullptr, source_ud, bPerformConflictCheck, userdata_conflict_resolution))
        {
          moved_item_count++;
          continue;
        }
      }

      // The transfer did not occur.  Resolve state of orphaned source_ud.
      if (nullptr != source_ud->m_userdata_owner || nullptr != source_ud->m_userdata_next)
      {
        ON_ERROR("There is a serious bug in this code.");
        continue;
      }
      if (bDeleteAllSourceItems)
      {
        // delete the orphan
        delete source_ud;
      }
      else
      {
        // reattach the orphan to source_object
        source_ud->m_userdata_owner = &source_object;
        if (nullptr == source_object.m_userdata_list)
        {
          source_object.m_userdata_list = source_ud;
        }
        else if (nullptr != source_object_userdata_last)
        {
          source_object_userdata_last->m_userdata_next = source_ud;
        }
        source_object_userdata_last = source_ud;
      }
    }
  }

  return moved_item_count;
}